

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

void gauden_norm_wt_mean(vector_t ***in_mean,vector_t ***wt_mean,float32 ***dnom,uint32 n_mgau,
                        uint32 n_feat,uint32 n_density,uint32 *veclen)

{
  float fVar1;
  uint uVar2;
  float32 *pfVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  for (uVar7 = 0; uVar7 != n_mgau; uVar7 = uVar7 + 1) {
    for (uVar6 = 0; uVar6 != n_feat; uVar6 = uVar6 + 1) {
      for (uVar5 = 0; uVar5 != n_density; uVar5 = uVar5 + 1) {
        pfVar3 = dnom[uVar7][uVar6];
        fVar1 = (float)pfVar3[uVar5];
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          uVar2 = veclen[uVar6];
          for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
            wt_mean[uVar7][uVar6][uVar5][uVar4] =
                 wt_mean[uVar7][uVar6][uVar5][uVar4] / (float)pfVar3[uVar5];
          }
        }
        else {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                  ,0x61f,"(mgau= %u, feat= %u, density= %u) never observed\n",uVar7 & 0xffffffff,
                  uVar6 & 0xffffffff,(int)uVar5);
          if (in_mean != (vector_t ***)0x0) {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                    ,0x621,"Copying it from in_mean\n");
            uVar2 = veclen[uVar6];
            for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
              wt_mean[uVar7][uVar6][uVar5][uVar4] = in_mean[uVar7][uVar6][uVar5][uVar4];
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
gauden_norm_wt_mean(vector_t ***in_mean,
		    vector_t ***wt_mean,
		    float32 ***dnom,
		    uint32 n_mgau,
		    uint32 n_feat,
		    uint32 n_density,
		    const uint32 *veclen)
{
    uint32 i, j, k, l;

    for (i = 0; i < n_mgau; i++) {
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		if (dnom[i][j][k] != 0) {
		    for (l = 0; l < veclen[j]; l++) {
			wt_mean[i][j][k][l] /= dnom[i][j][k];
		    }
		}
		else {
		    E_WARN("(mgau= %u, feat= %u, density= %u) never observed\n",
			   i, j, k);
		    if (in_mean) {
			E_INFO("Copying it from in_mean\n");
			for (l = 0; l < veclen[j]; l++) {
			    wt_mean[i][j][k][l] = in_mean[i][j][k][l];
			}
		    }
		}
	    }
	}
    }
}